

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  byte *pbVar3;
  pointer pTVar4;
  long lVar5;
  size_t size;
  
  if (this->len == 0) {
    pbVar3 = (byte *)0x0;
  }
  else {
    size = this->len * 0x10;
    pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar3 + size) {
      pbVar3 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
      if (this->len == 0) goto LAB_003aceb9;
      pTVar4 = this->data_;
      size = this->len << 4;
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar3 + size;
      pTVar4 = this->data_;
    }
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pTVar4->type).ptr + lVar5);
      uVar2 = puVar1[1];
      *(undefined8 *)(pbVar3 + lVar5) = *puVar1;
      *(undefined8 *)(pbVar3 + lVar5 + 8) = uVar2;
      lVar5 = lVar5 + 0x10;
    } while (puVar1 + 2 != (undefined8 *)((long)&(pTVar4->type).ptr + size));
    if (this->len != 0 && pbVar3 == (byte *)0x0) {
      std::terminate();
    }
  }
LAB_003aceb9:
  return (int)pbVar3;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }